

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuHeapD.c
# Opt level: O3

void Fxu_HeapDoubleMoveUp(Fxu_HeapDouble *p,Fxu_Double *pDiv)

{
  Fxu_Double **ppFVar1;
  int iVar2;
  uint uVar3;
  Fxu_Double *pFVar4;
  Fxu_Double *pFVar5;
  Fxu_Double *pDiv_1;
  uint uVar6;
  Fxu_Double **ppFVar7;
  
  pFVar4 = p->pTree[(int)pDiv];
  if (1 < pFVar4->HNum) {
    iVar2 = pFVar4->Weight;
    ppFVar7 = p->pTree + (int)pDiv;
    uVar6 = pFVar4->HNum;
    do {
      pFVar5 = p->pTree[uVar6 >> 1];
      if (iVar2 <= pFVar5->Weight) {
        return;
      }
      ppFVar1 = p->pTree + (uVar6 >> 1);
      *ppFVar7 = pFVar5;
      *ppFVar1 = pFVar4;
      uVar3 = (*ppFVar7)->HNum;
      (*ppFVar7)->HNum = uVar6;
      pFVar4->HNum = uVar3;
      ppFVar7 = ppFVar1;
      uVar6 = uVar3;
    } while (1 < (int)uVar3);
  }
  return;
}

Assistant:

void Fxu_HeapDoubleMoveUp( Fxu_HeapDouble * p, Fxu_Double * pDiv )
{
	Fxu_Double ** ppDiv, ** ppPar;
	ppDiv = &FXU_HEAP_DOUBLE_CURRENT(p, pDiv);
	while ( FXU_HEAP_DOUBLE_PARENT_EXISTS(p,*ppDiv) )
	{
		ppPar = &FXU_HEAP_DOUBLE_PARENT(p,*ppDiv);
		if ( FXU_HEAP_DOUBLE_WEIGHT(*ppDiv) > FXU_HEAP_DOUBLE_WEIGHT(*ppPar) )
		{
			Fxu_HeapDoubleSwap( ppDiv, ppPar );
			ppDiv = ppPar;
		}
		else
			break;
	}
}